

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathFreeCache(xmlXPathContextCachePtr cache)

{
  if (cache->nodesetObjs != (xmlPointerListPtr)0x0) {
    xmlXPathCacheFreeObjectList(cache->nodesetObjs);
  }
  if (cache->stringObjs != (xmlPointerListPtr)0x0) {
    xmlXPathCacheFreeObjectList(cache->stringObjs);
  }
  if (cache->booleanObjs != (xmlPointerListPtr)0x0) {
    xmlXPathCacheFreeObjectList(cache->booleanObjs);
  }
  if (cache->numberObjs != (xmlPointerListPtr)0x0) {
    xmlXPathCacheFreeObjectList(cache->numberObjs);
  }
  if (cache->miscObjs != (xmlPointerListPtr)0x0) {
    xmlXPathCacheFreeObjectList(cache->miscObjs);
  }
  (*xmlFree)(cache);
  return;
}

Assistant:

static void
xmlXPathFreeCache(xmlXPathContextCachePtr cache)
{
    if (cache == NULL)
	return;
    if (cache->nodesetObjs)
	xmlXPathCacheFreeObjectList(cache->nodesetObjs);
    if (cache->stringObjs)
	xmlXPathCacheFreeObjectList(cache->stringObjs);
    if (cache->booleanObjs)
	xmlXPathCacheFreeObjectList(cache->booleanObjs);
    if (cache->numberObjs)
	xmlXPathCacheFreeObjectList(cache->numberObjs);
    if (cache->miscObjs)
	xmlXPathCacheFreeObjectList(cache->miscObjs);
    xmlFree(cache);
}